

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_large_scale_tile_obu
               (AV1_COMP *cpi,uint8_t *dst,LargeTileFrameOBU *lst_obu,int *largest_tile_id,
               uint32_t *total_size,int have_tiles,uint *max_tile_size,uint *max_tile_col_size)

{
  int iVar1;
  int iVar2;
  TileDataEnc *pTVar3;
  uint uVar4;
  int tile_col_00;
  int iVar5;
  uint uVar6;
  AV1_COMMON *cm_00;
  int *in_RCX;
  long lVar7;
  uint *in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  uint *in_R8;
  int in_R9D;
  uint *in_stack_00000008;
  uint *in_stack_00000010;
  uint32_t col_size;
  int identical_tile_offset;
  int tile_copy_mode;
  uint32_t tile_header;
  aom_writer mode_bc;
  TileDataEnc *this_tile;
  int tile_idx;
  int data_offset;
  TileBufferEnc *buf;
  int tile_row;
  uint32_t col_offset;
  int is_last_col;
  TileInfo tile_info;
  int tile_col;
  uint tile_size;
  int tile_rows;
  int tile_cols;
  TileBufferEnc tile_buffers [64] [64];
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  uint8_t *in_stack_fffffffffffeff08;
  undefined4 in_stack_fffffffffffeff10;
  uint in_stack_fffffffffffeff14;
  int in_stack_fffffffffffeff18;
  uint in_stack_fffffffffffeff1c;
  int iStack_100d4;
  uint uStack_100d0;
  TileBufferEnc (*in_stack_fffffffffffeff50) [64];
  int in_stack_fffffffffffeff5c;
  uint in_stack_fffffffffffeff60;
  aom_writer *w;
  undefined4 in_stack_fffffffffffeff80;
  int row;
  uint uVar8;
  AV1_COMP *in_stack_fffffffffffeff90;
  int iStack_10058;
  uint uStack_10054;
  
  cm_00 = &in_RDI->common;
  iVar1 = (in_RDI->common).tiles.cols;
  iVar2 = (in_RDI->common).tiles.rows;
  av1_reset_pack_bs_thread_data((ThreadData_conflict *)0x1f2a75);
  for (iStack_10058 = 0; iStack_10058 < iVar1; iStack_10058 = iStack_10058 + 1) {
    uVar4 = (uint)(iStack_10058 == iVar1 + -1);
    uVar8 = *in_R8;
    av1_tile_set_col((TileInfo *)&stack0xfffffffffffeff90,cm_00,iStack_10058);
    if (uVar4 == 0) {
      *in_R8 = *in_R8 + 4;
    }
    for (row = 0; row < iVar2; row = row + 1) {
      w = (aom_writer *)(&stack0xfffffffffffeffb8 + (long)iStack_10058 * 0x10 + (long)row * 0x400);
      iVar5 = 0;
      if (in_R9D != 0) {
        iVar5 = 4;
      }
      tile_col_00 = row * iVar1 + iStack_10058;
      pTVar3 = in_RDI->tile_data;
      lVar7 = (long)tile_col_00;
      av1_tile_set_row((TileInfo *)&stack0xfffffffffffeff90,cm_00,row);
      *(ulong *)w = in_RSI + (ulong)*in_R8 + (ulong)*in_RDX;
      *in_R8 = iVar5 + *in_R8;
      (in_RDI->td).mb.e_mbd.tile_ctx = &pTVar3[lVar7].tctx;
      uVar6 = in_stack_fffffffffffeff1c & 0xffffff;
      if ((in_RDI->common).tiles.large_scale == 0) {
        uVar6 = CONCAT13((in_RDI->common).features.disable_cdf_update,
                         (int3)in_stack_fffffffffffeff1c) ^ 0xff000000;
      }
      in_stack_fffffffffffeff1c = uVar6;
      in_stack_fffffffffffeff60 =
           CONCAT31((int3)(in_stack_fffffffffffeff60 >> 8),(char)(in_stack_fffffffffffeff1c >> 0x18)
                   ) & 0xffffff01;
      aom_start_encode((aom_writer *)CONCAT44(in_stack_fffffffffffeff14,in_stack_fffffffffffeff10),
                       in_stack_fffffffffffeff08);
      write_modes(in_stack_fffffffffffeff90,(ThreadData_conflict *)CONCAT44(uVar4,uVar8),
                  (TileInfo *)CONCAT44(row,in_stack_fffffffffffeff80),w,iVar5,tile_col_00);
      iVar5 = aom_stop_encode((aom_writer *)
                              CONCAT44(in_stack_fffffffffffeff1c,in_stack_fffffffffffeff18));
      if (iVar5 < 0) {
        aom_internal_error((in_RDI->common).error,AOM_CODEC_ERROR,"Error writing modes");
      }
      uStack_10054 = uStack_100d0;
      w->buffer = (uint8_t *)(ulong)uStack_100d0;
      if (*in_stack_00000008 < uStack_100d0) {
        *in_stack_00000008 = uStack_100d0;
        *in_RCX = iVar1 * row + iStack_10058;
      }
      if (in_R9D != 0) {
        iStack_100d4 = uStack_100d0 - 1;
        if ((in_RDI->common).tiles.height < (in_RDI->common).tiles.width) {
          in_stack_fffffffffffeff18 = (in_RDI->common).tiles.width;
        }
        else {
          in_stack_fffffffffffeff18 = (in_RDI->common).tiles.height;
        }
        if ((((cm_00->current_frame).frame_type != '\0') && (in_stack_fffffffffffeff18 * 4 < 0x101))
           && (uVar6 = find_identical_tile(in_stack_fffffffffffeff60,in_stack_fffffffffffeff5c,
                                           in_stack_fffffffffffeff50), 0 < (int)uVar6)) {
          uStack_10054 = 0;
          iStack_100d4 = (uVar6 | 0x80) << 0x18;
        }
        mem_put_le32_as_int(*(void **)w,iStack_100d4);
      }
      *in_R8 = uStack_10054 + *in_R8;
    }
    if (uVar4 == 0) {
      in_stack_fffffffffffeff14 = (*in_R8 - uVar8) - 4;
      mem_put_le32_as_int((void *)(in_RSI + (ulong)uVar8 + (ulong)*in_RDX),in_stack_fffffffffffeff14
                         );
      if (in_stack_fffffffffffeff14 < *in_stack_00000010) {
        in_stack_fffffffffffeff14 = *in_stack_00000010;
      }
      *in_stack_00000010 = in_stack_fffffffffffeff14;
    }
  }
  av1_accumulate_pack_bs_thread_data(in_RDI,&in_RDI->td);
  return;
}

Assistant:

static void write_large_scale_tile_obu(
    AV1_COMP *const cpi, uint8_t *const dst, LargeTileFrameOBU *const lst_obu,
    int *const largest_tile_id, uint32_t *total_size, const int have_tiles,
    unsigned int *const max_tile_size, unsigned int *const max_tile_col_size) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;

  TileBufferEnc tile_buffers[MAX_TILE_ROWS][MAX_TILE_COLS];
  const int tile_cols = tiles->cols;
  const int tile_rows = tiles->rows;
  unsigned int tile_size = 0;

  av1_reset_pack_bs_thread_data(&cpi->td);
  for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
    TileInfo tile_info;
    const int is_last_col = (tile_col == tile_cols - 1);
    const uint32_t col_offset = *total_size;

    av1_tile_set_col(&tile_info, cm, tile_col);

    // The last column does not have a column header
    if (!is_last_col) *total_size += 4;

    for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
      TileBufferEnc *const buf = &tile_buffers[tile_row][tile_col];
      const int data_offset = have_tiles ? 4 : 0;
      const int tile_idx = tile_row * tile_cols + tile_col;
      TileDataEnc *this_tile = &cpi->tile_data[tile_idx];
      av1_tile_set_row(&tile_info, cm, tile_row);
      aom_writer mode_bc;

      buf->data = dst + *total_size + lst_obu->tg_hdr_size;

      // Is CONFIG_EXT_TILE = 1, every tile in the row has a header,
      // even for the last one, unless no tiling is used at all.
      *total_size += data_offset;
      cpi->td.mb.e_mbd.tile_ctx = &this_tile->tctx;
      mode_bc.allow_update_cdf = !tiles->large_scale;
      mode_bc.allow_update_cdf =
          mode_bc.allow_update_cdf && !cm->features.disable_cdf_update;
      aom_start_encode(&mode_bc, buf->data + data_offset);
      write_modes(cpi, &cpi->td, &tile_info, &mode_bc, tile_row, tile_col);
      if (aom_stop_encode(&mode_bc) < 0) {
        aom_internal_error(cm->error, AOM_CODEC_ERROR, "Error writing modes");
      }
      tile_size = mode_bc.pos;
      buf->size = tile_size;

      // Record the maximum tile size we see, so we can compact headers later.
      if (tile_size > *max_tile_size) {
        *max_tile_size = tile_size;
        *largest_tile_id = tile_cols * tile_row + tile_col;
      }

      if (have_tiles) {
        // tile header: size of this tile, or copy offset
        uint32_t tile_header = tile_size - AV1_MIN_TILE_SIZE_BYTES;
        const int tile_copy_mode =
            ((AOMMAX(tiles->width, tiles->height) << MI_SIZE_LOG2) <= 256) ? 1
                                                                           : 0;

        // If tile_copy_mode = 1, check if this tile is a copy tile.
        // Very low chances to have copy tiles on the key frames, so don't
        // search on key frames to reduce unnecessary search.
        if (cm->current_frame.frame_type != KEY_FRAME && tile_copy_mode) {
          const int identical_tile_offset =
              find_identical_tile(tile_row, tile_col, tile_buffers);

          // Indicate a copy-tile by setting the most significant bit.
          // The row-offset to copy from is stored in the highest byte.
          // remux_tiles will move these around later
          if (identical_tile_offset > 0) {
            tile_size = 0;
            tile_header = identical_tile_offset | 0x80;
            tile_header <<= 24;
          }
        }

        mem_put_le32(buf->data, (MEM_VALUE_T)tile_header);
      }

      *total_size += tile_size;
    }
    if (!is_last_col) {
      uint32_t col_size = *total_size - col_offset - 4;
      mem_put_le32(dst + col_offset + lst_obu->tg_hdr_size, col_size);

      // Record the maximum tile column size we see.
      *max_tile_col_size = AOMMAX(*max_tile_col_size, col_size);
    }
  }
  av1_accumulate_pack_bs_thread_data(cpi, &cpi->td);
}